

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline_parser.cpp
# Opt level: O1

bool __thiscall
tlx::CmdlineParser::ArgumentString::process(ArgumentString *this,int *argc,char ***argv)

{
  int iVar1;
  char *__s;
  string *psVar2;
  char *pcVar3;
  
  iVar1 = *argc;
  if (iVar1 != 0) {
    __s = **argv;
    psVar2 = this->dest_;
    pcVar3 = (char *)psVar2->_M_string_length;
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)psVar2,0,pcVar3,(ulong)__s);
    *argc = *argc + -1;
    *argv = *argv + 1;
  }
  return iVar1 != 0;
}

Assistant:

bool process(int& argc, const char* const*& argv) final { // NOLINT
        if (argc == 0)
            return false;
        dest_ = argv[0];
        --argc, ++argv;
        return true;
    }